

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  bool bVar1;
  DescriptorPool *in_RSI;
  long in_RDI;
  Symbol SVar2;
  FileDescriptor *file_result;
  Symbol result;
  MutexLockMaybe lock;
  Mutex *in_stack_ffffffffffffff48;
  FileDescriptor *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  Tables *in_stack_ffffffffffffff60;
  undefined4 uStack_5c;
  Symbol local_38;
  string *in_stack_ffffffffffffffe0;
  FileDescriptor *local_8;
  
  internal::MutexLockMaybe::MutexLockMaybe
            ((MutexLockMaybe *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (*(long *)(in_RDI + 8) != 0) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x620a6e);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x620a7a);
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x620a88);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x620a94);
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x620aa2);
  SVar2 = Tables::FindSymbol(in_stack_ffffffffffffff60,
                             (string *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)
                            );
  local_38.field_1 = SVar2.field_1;
  local_38.type = SVar2.type;
  bVar1 = Symbol::IsNull(&local_38);
  if (bVar1) {
    if ((*(long *)(in_RDI + 0x18) == 0) ||
       (local_8 = FindFileContainingSymbol(in_RSI,in_stack_ffffffffffffffe0),
       local_8 == (FileDescriptor *)0x0)) {
      bVar1 = TryFindSymbolInFallbackDatabase
                        ((DescriptorPool *)result.field_1.descriptor,(string *)result._0_8_);
      if (bVar1) {
        std::
        unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
        ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      *)0x620bca);
        SVar2 = Tables::FindSymbol(in_stack_ffffffffffffff60,
                                   (string *)
                                   CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        local_38.field_1 = SVar2.field_1;
        local_38._4_4_ = uStack_5c;
        local_38.type = SVar2.type;
        bVar1 = Symbol::IsNull(&local_38);
        if (!bVar1) {
          in_stack_ffffffffffffff50 =
               Symbol::GetFile((Symbol *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
          local_8 = in_stack_ffffffffffffff50;
          goto LAB_00620c62;
        }
      }
      local_8 = (FileDescriptor *)0x0;
    }
  }
  else {
    local_8 = Symbol::GetFile((Symbol *)
                              CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
LAB_00620c62:
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)in_stack_ffffffffffffff50);
  return local_8;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const std::string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != nullptr) {
    const FileDescriptor* file_result =
        underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != nullptr) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return nullptr;
}